

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmregex.h
# Opt level: O2

void __thiscall CRegexStack::save_loop_var(CRegexStack *this,int id,short *loop_vars)

{
  regex_stack_var *prVar1;
  
  if ((this->sp_ != -1) && (prVar1 = new_reg_or_var(this,id + 10), prVar1 != (regex_stack_var *)0x0)
     ) {
    (prVar1->val).loopvar = loop_vars[id];
  }
  return;
}

Assistant:

void save_loop_var(int id, const short *loop_vars)
    {
        /* 
         *   allocate a new slot if needed and save the value; note that
         *   loop variables are identified by the loop variable ID plus the
         *   base index RE_GROUP_REG_CNT 
         */
        regex_stack_var *var;
        if (sp_ != -1 && (var = new_reg_or_var(id + RE_GROUP_REG_CNT)) != 0)
            var->val.loopvar = loop_vars[id];
    }